

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureGenerationSpec::TextureGenerationSpec
          (TextureGenerationSpec *this)

{
  TextureGenerationSpec *this_local;
  
  this->immutable = true;
  this->fixedSamplePos = true;
  this->sampleCount = 0;
  this->texBufferDataOffset = 0;
  this->texBufferDataSize = 0x100;
  this->bindWholeArray = false;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ::vector(&this->levels);
  std::__cxx11::string::string((string *)&this->description);
  return;
}

Assistant:

TextureGenerationSpec (void)
		: immutable				(true)
		, fixedSamplePos		(true)
		, sampleCount			(0)
		, texBufferDataOffset	(0)
		, texBufferDataSize		(256)
		, bindWholeArray		(false)
	{
	}